

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O1

shared_ptr<gui::TextBox> __thiscall gui::TextBox::create(TextBox *this,Theme *theme,String *name)

{
  TextBox *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gui::TextBox> sVar1;
  locale alStack_68 [8];
  shared_ptr<gui::TextBoxStyle> local_60;
  String local_50;
  
  this_00 = (TextBox *)operator_new(0x3a8);
  std::locale::locale(alStack_68);
  sf::String::String(&local_50,"TextBox",alStack_68);
  Theme::getStyle<gui::TextBoxStyle>((Theme *)&local_60,(String *)theme);
  TextBox(this_00,&local_60,name);
  (this->super_Widget).super_Drawable._vptr_Drawable = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<gui::TextBox*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_Widget).super_enable_shared_from_this<gui::Widget>,this_00);
  std::__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<gui::TextBox,gui::TextBox>
            ((__shared_ptr<gui::TextBox,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  if ((Gui *)local_60.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi != (Gui *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
    operator_delete(local_50.m_string._M_dataplus._M_p);
  }
  std::locale::~locale(alStack_68);
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::TextBox>)
         sVar1.super___shared_ptr<gui::TextBox,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextBox> TextBox::create(const Theme& theme, const sf::String& name) {
    return std::shared_ptr<TextBox>(new TextBox(theme.getStyle<TextBoxStyle>("TextBox"), name));
}